

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall
file<std::basic_ofstream<char,_std::char_traits<char>_>_>::~file
          (file<std::basic_ofstream<char,_std::char_traits<char>_>_> *this,void **vtt)

{
  ofstream *in_RDI;
  
  std::ofstream::~ofstream(in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 0xf8));
  return;
}

Assistant:

file(const std::string& name)  // non explicit
      : std::string{name}, TFStream{name} {}